

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void assignment(Vm *vm)

{
  char *name;
  size_t length;
  _Bool _Var1;
  Variable VVar2;
  Variable var;
  Token identifier;
  Vm *vm_local;
  
  logic_or(vm);
  name = (vm->compiler).previous.start;
  length = (vm->compiler).previous.length;
  _Var1 = check(vm,TOKEN_EQUALS);
  if (_Var1) {
    emit_no_arg(vm,OP_POP);
    consume((Token *)&var.frame_offset,vm,TOKEN_EQUALS,"Expected \'=\' after variable name");
    expr(vm);
    VVar2 = resolve_var(vm,name,length);
    if (((undefined1  [16])VVar2 & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
      error(&vm->compiler,"Cannot reassign val");
    }
    emit_no_arg(vm,OP_DUP);
    var.index = VVar2.frame_offset;
    if (var.index == vm->frame_count) {
      emit_byte_arg(vm,OP_STORE,(uint8_t)VVar2.index);
    }
    else {
      emit_short_arg(vm,OP_STORE_OFFSET,(uint8_t)VVar2.frame_offset,(uint8_t)VVar2.index);
    }
  }
  return;
}

Assistant:

static void assignment(Vm *vm) {
    logic_or(vm);
    Token identifier = vm->compiler.previous;

    if (check(vm, TOKEN_EQUALS)) {
        // TODO remove unnecessary LOAD-POP combination
        emit_no_arg(vm, OP_POP);
        consume(vm, TOKEN_EQUALS, "Expected '=' after variable name");
        expr(vm);
        Variable var = resolve_var(vm, identifier.start, identifier.length);

        if (!var.assignable) {
            error(&vm->compiler, "Cannot reassign val");
        }

        emit_no_arg(vm, OP_DUP);

        if (var.frame_offset != vm->frame_count) {
            // TODO bigger numbers
            emit_short_arg(vm, OP_STORE_OFFSET, (uint8_t) var.frame_offset, (uint8_t) var.index);
        } else {
            emit_byte_arg(vm, OP_STORE, (uint8_t) var.index);
        }
    }
}